

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
* deqp::gles3::Performance::singleValueShaderAttributes
            (vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *__return_storage_ptr__,string *nameSpecialization)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  Vec4 local_f8;
  Vec4 local_e8;
  Vec4 local_d8;
  Vec4 local_c8;
  AttribSpec local_b8;
  Vector<float,_16> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&bStack_118,"a_position",nameSpecialization);
  local_c8.m_data[0] = -1.0;
  local_c8.m_data[1] = -1.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 1.0;
  local_d8.m_data[0] = -1.0;
  local_d8.m_data[1] = 1.0;
  local_d8.m_data[2] = 0.0;
  local_d8.m_data[3] = 1.0;
  local_e8.m_data[0] = 1.0;
  local_e8.m_data[1] = -1.0;
  local_e8.m_data[2] = 0.0;
  local_e8.m_data[3] = 1.0;
  local_f8.m_data[0] = 1.0;
  local_f8.m_data[1] = 1.0;
  local_f8.m_data[2] = 0.0;
  local_f8.m_data[3] = 1.0;
  combineVec4ToVec16(&local_58,&local_c8,&local_d8,&local_e8,&local_f8);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_b8,&bStack_118,&local_58);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (__return_storage_ptr__,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&bStack_118);
  std::operator+(&bStack_118,"a_value",nameSpecialization);
  local_c8.m_data[0] = 1.0;
  local_c8.m_data[1] = 1.0;
  local_c8.m_data[2] = 1.0;
  local_c8.m_data[3] = 1.0;
  local_d8.m_data[0] = 1.0;
  local_d8.m_data[1] = 1.0;
  local_d8.m_data[2] = 1.0;
  local_d8.m_data[3] = 1.0;
  local_e8.m_data[0] = 1.0;
  local_e8.m_data[1] = 1.0;
  local_e8.m_data[2] = 1.0;
  local_e8.m_data[3] = 1.0;
  local_f8.m_data[0] = 1.0;
  local_f8.m_data[1] = 1.0;
  local_f8.m_data[2] = 1.0;
  local_f8.m_data[3] = 1.0;
  combineVec4ToVec16(&local_58,&local_c8,&local_d8,&local_e8,&local_f8);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_b8,&bStack_118,&local_58);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (__return_storage_ptr__,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&bStack_118);
  return __return_storage_ptr__;
}

Assistant:

static vector<ShaderCompilerCase::AttribSpec> singleValueShaderAttributes (const string& nameSpecialization)
{
	vector<ShaderCompilerCase::AttribSpec> result;

	result.push_back(ShaderCompilerCase::AttribSpec("a_position" + nameSpecialization,
													combineVec4ToVec16(Vec4(-1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4(-1.0f,  1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  0.0f,  1.0f))));

	result.push_back(ShaderCompilerCase::AttribSpec("a_value" + nameSpecialization,
													combineVec4ToVec16(Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f))));

	return result;
}